

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O0

QDataStream * QtPrivate::writeSequentialContainer<QList<int>>(QDataStream *s,QList<int> *c)

{
  bool bVar1;
  const_iterator o;
  QDataStream *pQVar2;
  QList<int> *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  value_type_conflict4 *t;
  QList<int> *__range2;
  const_iterator __end0;
  const_iterator __begin0;
  QDataStream *in_stack_ffffffffffffffa8;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = in_RDI;
  QList<int>::size(in_RSI);
  bVar1 = QDataStream::writeQSizeType(in_stack_ffffffffffffffa8,0x63abb1);
  if (bVar1) {
    local_10.i = (int *)&DAT_aaaaaaaaaaaaaaaa;
    local_10 = QList<int>::begin((QList<int> *)pQVar2);
    o = QList<int>::end((QList<int> *)pQVar2);
    while (bVar1 = QList<int>::const_iterator::operator!=(&local_10,o), bVar1) {
      pQVar2 = (QDataStream *)QList<int>::const_iterator::operator*(&local_10);
      QDataStream::operator<<(pQVar2,(qint32)((ulong)in_RSI >> 0x20));
      QList<int>::const_iterator::operator++(&local_10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QDataStream &writeSequentialContainer(QDataStream &s, const Container &c)
{
    if (!QDataStream::writeQSizeType(s, c.size()))
        return s;
    for (const typename Container::value_type &t : c)
        s << t;

    return s;
}